

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::InRange(Character *this,uchar x,uchar y)

{
  byte bVar1;
  byte bVar2;
  World *pWVar3;
  int iVar4;
  int iVar5;
  mapped_type *this_00;
  int iVar6;
  int iVar7;
  allocator<char> local_51;
  key_type local_50;
  
  bVar1 = this->x;
  bVar2 = this->y;
  pWVar3 = this->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SeeDistance",&local_51);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&pWVar3->config,&local_50);
  iVar5 = util::variant::GetInt(this_00);
  iVar7 = (uint)bVar2 - (uint)y;
  iVar4 = -iVar7;
  if (0 < iVar7) {
    iVar4 = iVar7;
  }
  iVar6 = (uint)bVar1 - (uint)x;
  iVar7 = -iVar6;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return iVar7 + iVar4 <= iVar5;
}

Assistant:

bool Character::InRange(unsigned char x, unsigned char y) const
{
	return util::path_length(this->x, this->y, x, y) <= static_cast<int>(this->world->config.at("SeeDistance"));
}